

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_of(size_t n_args,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ulong in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint32_t val;
  size_t i;
  va_list ap;
  roaring_bulk_context_t context;
  roaring_bitmap_t *answer;
  roaring_bulk_context_t *in_stack_fffffffffffffee8;
  void ***r;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_44;
  ulong local_40;
  uint local_38;
  undefined4 local_34;
  void ***local_30;
  undefined1 *local_28;
  undefined1 local_20 [16];
  roaring_bitmap_t *local_10;
  ulong local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_8 = in_RDI;
  local_10 = roaring_bitmap_create();
  memset(local_20,0,0x10);
  local_28 = local_f8;
  local_30 = (void ***)&stack0x00000008;
  local_34 = 0x30;
  local_38 = 8;
  for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
    if (local_38 < 0x29) {
      lVar1 = (long)(int)local_38;
      local_38 = local_38 + 8;
      r = (void ***)(local_28 + lVar1);
    }
    else {
      r = local_30;
      local_30 = local_30 + 1;
    }
    local_44 = *(undefined4 *)r;
    roaring_bitmap_add_bulk((roaring_bitmap_t *)r,in_stack_fffffffffffffee8,0);
  }
  return local_10;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_of(size_t n_args, ...) {
    // todo: could be greatly optimized but we do not expect this call to ever
    // include long lists
    roaring_bitmap_t *answer = roaring_bitmap_create();
    roaring_bulk_context_t context = CROARING_ZERO_INITIALIZER;
    va_list ap;
    va_start(ap, n_args);
    for (size_t i = 0; i < n_args; i++) {
        uint32_t val = va_arg(ap, uint32_t);
        roaring_bitmap_add_bulk(answer, &context, val);
    }
    va_end(ap);
    return answer;
}